

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double<double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          double value,format_specs *spec)

{
  ulong uVar1;
  byte bVar2;
  alignment aVar3;
  basic_buffer<char> *pbVar4;
  char *pcVar5;
  char cVar6;
  double dVar7;
  float_spec_handler handler;
  align_spec as;
  write_inf_or_nan_t write_inf_or_nan;
  memory_buffer buffer;
  float_spec_handler local_2aa;
  align_spec local_2a8;
  double local_298;
  double_writer local_280;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *local_268;
  undefined1 local_260 [16];
  undefined2 local_250;
  char local_24c;
  buffer local_248;
  char local_228 [504];
  
  local_2aa.type = (spec->super_core_format_specs).type;
  local_2aa.upper = false;
  local_298 = value;
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>(local_2aa.type,&local_2aa);
  if ((long)local_298 < 0) {
    dVar7 = (double)((ulong)local_298 ^ (ulong)DAT_0011a020);
    cVar6 = '-';
  }
  else {
    bVar2 = (spec->super_core_format_specs).flags;
    dVar7 = local_298;
    if ((bVar2 & 1) == 0) {
      cVar6 = '\0';
    }
    else {
      cVar6 = '+';
      if ((bVar2 & 2) == 0) {
        cVar6 = ' ';
      }
    }
  }
  local_260._0_4_ = (spec->super_align_spec).width_;
  local_260._4_4_ = (spec->super_align_spec).fill_;
  local_260._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  local_250._0_1_ = (spec->super_core_format_specs).flags;
  local_250._1_1_ = (spec->super_core_format_specs).type;
  local_268 = this;
  local_24c = cVar6;
  if (NAN(dVar7)) {
    pcVar5 = "NAN";
    local_248.ptr_ = "nan";
LAB_0010dd6b:
    if (local_2aa.upper != false) {
      local_248.ptr_ = pcVar5;
    }
    local_248._vptr_basic_buffer = (_func_int **)CONCAT71(local_248._vptr_basic_buffer._1_7_,cVar6);
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::inf_or_nan_writer>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,(align_spec *)local_260,(inf_or_nan_writer *)&local_248);
    return;
  }
  if (INFINITY <= dVar7) {
    pcVar5 = "INF";
    local_248.ptr_ = "inf";
    goto LAB_0010dd6b;
  }
  local_248.size_ = 0;
  local_248._vptr_basic_buffer = (_func_int **)&PTR_grow_00124ff0;
  local_248.capacity_ = 500;
  local_248.ptr_ = local_228;
  internal::sprintf_format<double>
            (dVar7,&local_248,
             (core_format_specs)
             ((ulong)spec->super_core_format_specs & 0xffff00ffffffffff |
             (ulong)(byte)local_2aa.type << 0x28));
  local_280.n = local_248.size_;
  local_2a8.align_ = (spec->super_align_spec).align_;
  local_2a8.width_ = (spec->super_align_spec).width_;
  local_2a8.fill_ = (spec->super_align_spec).fill_;
  aVar3 = (spec->super_align_spec).align_;
  if (aVar3 == ALIGN_DEFAULT) {
    local_2a8.align_ = ALIGN_RIGHT;
  }
  else if (aVar3 == ALIGN_NUMERIC) {
    if (cVar6 != '\0') {
      pbVar4 = (this->out_).container;
      dVar7 = (double)pbVar4->size_;
      uVar1 = (long)dVar7 + 1;
      if (pbVar4->capacity_ < uVar1) {
        local_298 = dVar7;
        (**pbVar4->_vptr_basic_buffer)(pbVar4,uVar1);
        dVar7 = local_298;
      }
      pbVar4->size_ = uVar1;
      pbVar4->ptr_[(long)dVar7] = cVar6;
      if (local_2a8.width_ != 0) {
        local_2a8.width_ = local_2a8.width_ - 1;
      }
    }
    local_2a8.align_ = ALIGN_RIGHT;
    local_280.sign = '\0';
    goto LAB_0010de65;
  }
  local_280.n = (local_248.size_ + 1) - (ulong)(cVar6 == '\0');
  local_280.sign = cVar6;
LAB_0010de65:
  local_280.buffer = &local_248;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,&local_2a8,&local_280);
  local_248._vptr_basic_buffer = (_func_int **)&PTR_grow_00124ff0;
  if (local_248.ptr_ == local_228) {
    return;
  }
  operator_delete(local_248.ptr_,local_248.capacity_);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}